

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_transformer.h
# Opt level: O3

longlong __thiscall
shift_window_transformer::SwinTransformer<float>::parameterCount(SwinTransformer<float> *this)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  long lVar6;
  
  lVar2 = StageModule<float>::parameterCount(&this->stage1);
  lVar3 = StageModule<float>::parameterCount(&this->stage2);
  lVar4 = StageModule<float>::parameterCount(&this->stage3);
  lVar5 = StageModule<float>::parameterCount(&this->stage4);
  pvVar1 = (this->linear).weights;
  lVar6 = (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if ((this->linear).use_bias == true) {
    pvVar1 = (this->linear).bias;
    lVar6 = lVar6 + ((long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  }
  return lVar4 + lVar5 + lVar3 + lVar2 + lVar6;
}

Assistant:

long long parameterCount() {
            return stage1.parameterCount() + stage2.parameterCount() + stage3.parameterCount() +
                   stage4.parameterCount() + layerNorm.parameterCount() + linear.parameterCount();
        }